

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

void Intra16Preds_C(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  ulong uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 uVar18;
  int j_1;
  long lVar19;
  uint8_t *puVar20;
  int j;
  long lVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      uVar18 = 0x80;
    }
    else {
      lVar19 = 0;
      iVar24 = 0;
      iVar25 = 0;
      iVar26 = 0;
      iVar27 = 0;
      do {
        uVar22 = *(undefined4 *)(left + lVar19);
        uVar13 = (ulong)(ushort)uVar22 & 0xffffffffffff00ff;
        auVar10._8_4_ = 0;
        auVar10._0_8_ = uVar13;
        auVar10[0xc] = (char)((uint)uVar22 >> 0x18);
        auVar11[8] = (char)((uint)uVar22 >> 0x10);
        auVar11._0_8_ = uVar13;
        auVar11[9] = 0;
        auVar11._10_3_ = auVar10._10_3_;
        auVar17._5_8_ = 0;
        auVar17._0_5_ = auVar11._8_5_;
        auVar12[4] = (char)((uint)uVar22 >> 8);
        auVar12._0_4_ = (int)uVar13;
        auVar12[5] = 0;
        auVar12._6_7_ = SUB137(auVar17 << 0x40,6);
        iVar24 = iVar24 + (int)uVar13;
        iVar25 = iVar25 + auVar12._4_4_;
        iVar26 = iVar26 + auVar11._8_4_;
        iVar27 = iVar27 + (uint)(uint3)(auVar10._10_3_ >> 0x10);
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      uVar18 = (undefined1)((iVar27 + iVar25 + iVar26 + iVar24) * 2 + 0x10U >> 5);
    }
  }
  else {
    lVar19 = 0;
    iVar24 = 0;
    iVar25 = 0;
    iVar26 = 0;
    iVar27 = 0;
    do {
      uVar22 = *(undefined4 *)(top + lVar19);
      uVar13 = (ulong)(ushort)uVar22 & 0xffffffffffff00ff;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar13;
      auVar4[0xc] = (char)((uint)uVar22 >> 0x18);
      auVar5[8] = (char)((uint)uVar22 >> 0x10);
      auVar5._0_8_ = uVar13;
      auVar5[9] = 0;
      auVar5._10_3_ = auVar4._10_3_;
      auVar15._5_8_ = 0;
      auVar15._0_5_ = auVar5._8_5_;
      auVar6[4] = (char)((uint)uVar22 >> 8);
      auVar6._0_4_ = (int)uVar13;
      auVar6[5] = 0;
      auVar6._6_7_ = SUB137(auVar15 << 0x40,6);
      iVar24 = iVar24 + (int)uVar13;
      iVar25 = iVar25 + auVar6._4_4_;
      iVar26 = iVar26 + auVar5._8_4_;
      iVar27 = iVar27 + (uint)(uint3)(auVar4._10_3_ >> 0x10);
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0x10);
    iVar24 = iVar27 + iVar25 + iVar26 + iVar24;
    if (left == (uint8_t *)0x0) {
      iVar24 = iVar24 * 2;
    }
    else {
      iVar25 = 0;
      iVar26 = 0;
      iVar27 = 0;
      lVar19 = 0;
      do {
        uVar22 = *(undefined4 *)(left + lVar19);
        uVar13 = (ulong)(ushort)uVar22 & 0xffffffffffff00ff;
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar13;
        auVar7[0xc] = (char)((uint)uVar22 >> 0x18);
        auVar8[8] = (char)((uint)uVar22 >> 0x10);
        auVar8._0_8_ = uVar13;
        auVar8[9] = 0;
        auVar8._10_3_ = auVar7._10_3_;
        auVar16._5_8_ = 0;
        auVar16._0_5_ = auVar8._8_5_;
        auVar9[4] = (char)((uint)uVar22 >> 8);
        auVar9._0_4_ = (int)uVar13;
        auVar9[5] = 0;
        auVar9._6_7_ = SUB137(auVar16 << 0x40,6);
        iVar24 = iVar24 + (int)uVar13;
        iVar25 = iVar25 + auVar9._4_4_;
        iVar26 = iVar26 + auVar8._8_4_;
        iVar27 = iVar27 + (uint)(uint3)(auVar7._10_3_ >> 0x10);
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      iVar24 = iVar27 + iVar25 + iVar26 + iVar24;
    }
    uVar18 = (undefined1)(iVar24 + 0x10 >> 5);
  }
  lVar19 = 0;
  auVar23 = pshuflw(ZEXT216(CONCAT11(uVar18,uVar18)),ZEXT216(CONCAT11(uVar18,uVar18)),0);
  uVar22 = auVar23._0_4_;
  do {
    puVar20 = dst + lVar19;
    *(undefined4 *)puVar20 = uVar22;
    *(undefined4 *)(puVar20 + 4) = uVar22;
    *(undefined4 *)(puVar20 + 8) = uVar22;
    *(undefined4 *)(puVar20 + 0xc) = uVar22;
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x200);
  lVar19 = 0;
  if (top == (uint8_t *)0x0) {
    do {
      builtin_memcpy(dst + lVar19 + 0x200,
                     "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",0x10);
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
  }
  else {
    do {
      uVar14 = *(undefined8 *)(top + 8);
      *(undefined8 *)(dst + lVar19 + 0x200) = *(undefined8 *)top;
      *(undefined8 *)(dst + lVar19 + 0x200 + 8) = uVar14;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
  }
  puVar20 = dst + 0x210;
  lVar19 = 0;
  if (left == (uint8_t *)0x0) {
    do {
      puVar1 = puVar20 + lVar19;
      puVar1[0] = 0x81;
      puVar1[1] = 0x81;
      puVar1[2] = 0x81;
      puVar1[3] = 0x81;
      puVar1[4] = 0x81;
      puVar1[5] = 0x81;
      puVar1[6] = 0x81;
      puVar1[7] = 0x81;
      puVar1[8] = 0x81;
      puVar1[9] = 0x81;
      puVar1[10] = 0x81;
      puVar1[0xb] = 0x81;
      puVar1[0xc] = 0x81;
      puVar1[0xd] = 0x81;
      puVar1[0xe] = 0x81;
      puVar1[0xf] = 0x81;
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x200);
  }
  else {
    do {
      auVar23 = ZEXT216(CONCAT11(left[lVar19],left[lVar19]));
      auVar23 = pshuflw(auVar23,auVar23,0);
      uVar22 = auVar23._0_4_;
      *(undefined4 *)puVar20 = uVar22;
      *(undefined4 *)(puVar20 + 4) = uVar22;
      *(undefined4 *)(puVar20 + 8) = uVar22;
      *(undefined4 *)(puVar20 + 0xc) = uVar22;
      lVar19 = lVar19 + 1;
      puVar20 = puVar20 + 0x20;
    } while (lVar19 != 0x10);
  }
  puVar20 = dst + 0x10;
  if (left == (uint8_t *)0x0) {
    lVar19 = 0;
    if (top == (uint8_t *)0x0) {
      do {
        puVar1 = puVar20 + lVar19;
        puVar1[0] = 0x81;
        puVar1[1] = 0x81;
        puVar1[2] = 0x81;
        puVar1[3] = 0x81;
        puVar1[4] = 0x81;
        puVar1[5] = 0x81;
        puVar1[6] = 0x81;
        puVar1[7] = 0x81;
        puVar1[8] = 0x81;
        puVar1[9] = 0x81;
        puVar1[10] = 0x81;
        puVar1[0xb] = 0x81;
        puVar1[0xc] = 0x81;
        puVar1[0xd] = 0x81;
        puVar1[0xe] = 0x81;
        puVar1[0xf] = 0x81;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x200);
    }
    else {
      do {
        uVar14 = *(undefined8 *)(top + 8);
        *(undefined8 *)(puVar20 + lVar19) = *(undefined8 *)top;
        *(undefined8 *)(puVar20 + lVar19 + 8) = uVar14;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x200);
    }
  }
  else if (top == (uint8_t *)0x0) {
    lVar19 = 0;
    do {
      auVar23 = ZEXT216(CONCAT11(left[lVar19],left[lVar19]));
      auVar23 = pshuflw(auVar23,auVar23,0);
      uVar22 = auVar23._0_4_;
      *(undefined4 *)puVar20 = uVar22;
      *(undefined4 *)(puVar20 + 4) = uVar22;
      *(undefined4 *)(puVar20 + 8) = uVar22;
      *(undefined4 *)(puVar20 + 0xc) = uVar22;
      lVar19 = lVar19 + 1;
      puVar20 = puVar20 + 0x20;
    } while (lVar19 != 0x10);
  }
  else {
    bVar2 = left[-1];
    lVar19 = 0;
    do {
      bVar3 = left[lVar19];
      lVar21 = 0;
      do {
        puVar20[lVar21] = clip1[(ulong)top[lVar21] + (ulong)bVar3 + (0xff - (ulong)bVar2)];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x10);
      puVar20 = puVar20 + 0x20;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x10);
  }
  return;
}

Assistant:

static WEBP_INLINE void DCMode(uint8_t* WEBP_RESTRICT dst,
                               const uint8_t* WEBP_RESTRICT left,
                               const uint8_t* WEBP_RESTRICT top,
                               int size, int round, int shift) {
  int DC = 0;
  int j;
  if (top != NULL) {
    for (j = 0; j < size; ++j) DC += top[j];
    if (left != NULL) {   // top and left present
      for (j = 0; j < size; ++j) DC += left[j];
    } else {      // top, but no left
      DC += DC;
    }
    DC = (DC + round) >> shift;
  } else if (left != NULL) {   // left but no top
    for (j = 0; j < size; ++j) DC += left[j];
    DC += DC;
    DC = (DC + round) >> shift;
  } else {   // no top, no left, nothing.
    DC = 0x80;
  }
  Fill(dst, DC, size);
}